

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O1

void * sx__malloc_leakd_cb(void *ptr,size_t size,uint32_t align,char *file,char *func,uint32_t line,
                          void *user_data)

{
  uint uVar1;
  code *pcVar2;
  void *pvVar3;
  void *pvVar4;
  uint8_t *aligned;
  size_t sz;
  ulong uVar5;
  void *__dest;
  void *in_stack_ffffffffffffffc8;
  
  if (size == 0) {
    if (ptr != (void *)0x0) {
      if (8 < align) {
        ptr = (void *)((long)ptr - (ulong)*(uint *)((long)ptr + -4));
      }
      stb_leakcheck_free(ptr);
    }
    pvVar3 = (void *)0x0;
  }
  else if (ptr == (void *)0x0) {
    if (align < 9) {
      pvVar3 = stb_leakcheck_malloc(size,file,func,line);
      return pvVar3;
    }
    uVar5 = 8;
    if (8 < (int)align) {
      uVar5 = (ulong)align;
    }
    sz = size + uVar5 + 4;
    if (sz == 0) {
      pvVar4 = (void *)0x0;
    }
    else {
      pvVar4 = stb_leakcheck_malloc(sz,file,func,line);
    }
    if (pvVar4 == (void *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                        ,0xb0,"ptr");
      pcVar2 = (code *)swi(3);
      pvVar3 = (void *)(*pcVar2)();
      return pvVar3;
    }
    uVar5 = (ulong)((int)uVar5 - 1);
    pvVar3 = (void *)(~uVar5 & (long)pvVar4 + uVar5 + 4);
    *(int *)((long)pvVar3 + -4) = (int)pvVar3 - (int)pvVar4;
  }
  else {
    pvVar3 = ptr;
    if (align < 9) {
      if ((*(ulong *)((long)ptr + -0x18) < size) &&
         (pvVar3 = stb_leakcheck_malloc(size,file,func,line), pvVar3 != (void *)0x0)) {
        memcpy(pvVar3,ptr,*(size_t *)((long)ptr + -0x18));
        stb_leakcheck_free(ptr);
      }
    }
    else {
      uVar1 = *(uint *)((long)ptr + -4);
      uVar5 = 8;
      if (8 < (int)align) {
        uVar5 = (ulong)align;
      }
      pvVar4 = sx__malloc_leakd_cb((void *)((long)ptr - (ulong)uVar1),size + uVar5 + 4,0,file,func,
                                   line,in_stack_ffffffffffffffc8);
      if (pvVar4 == (void *)0x0) {
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                          ,0xcd,"ptr");
        pcVar2 = (code *)swi(3);
        pvVar3 = (void *)(*pcVar2)();
        return pvVar3;
      }
      uVar5 = (ulong)((int)uVar5 - 1);
      __dest = (void *)(~uVar5 & (long)pvVar4 + uVar5 + 4);
      if (__dest != ptr) {
        memmove(__dest,(void *)((ulong)uVar1 + (long)pvVar4),size);
        *(int *)((long)__dest + -4) = (int)__dest - (int)pvVar4;
        pvVar3 = __dest;
      }
    }
  }
  return pvVar3;
}

Assistant:

static void* sx__malloc_leakd_cb(void* ptr, size_t size, uint32_t align, const char* file,
                                 const char* func, uint32_t line, void* user_data)
{
    sx_unused(user_data);
    if (size == 0) {
        if (ptr) {
            if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT) {
                stb_leakcheck_free(ptr);
                return NULL;
            }

            sx__aligned_free(&g_alloc_malloc_leakd, ptr, file, func, line);
        }
        return NULL;
    } else if (ptr == NULL) {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return stb_leakcheck_malloc(size, file, func, (int)line);

        return sx__aligned_alloc(&g_alloc_malloc_leakd, size, align, file, func, line);
    } else {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return stb_leakcheck_realloc(ptr, size, file, func, (int)line);

        return sx__aligned_realloc(&g_alloc_malloc_leakd, ptr, size, align, file, func, line);
    }
}